

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O1

double __thiscall SimpleConfiguration::deltaF(SimpleConfiguration *this,int n)

{
  iterator __position;
  pointer pdVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double local_28;
  
  iVar2 = this->nCounter;
  if (iVar2 <= n) {
    do {
      this->nCounter = iVar2 + 1;
      if (this->mF < 0) {
        local_28 = 0.0;
      }
      else {
        local_28 = 0.0;
        lVar3 = 0;
        dVar4 = 1.0;
        do {
          local_28 = local_28 +
                     (this->aF).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3] * dVar4;
          dVar4 = dVar4 * (double)(iVar2 + 1);
          lVar3 = lVar3 + 1;
        } while ((ulong)(uint)this->mF + 1 != lVar3);
      }
      __position._M_current =
           (this->fVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->fVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->fVal,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (this->fVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar2 = this->nCounter;
    } while (iVar2 <= n);
  }
  pdVar1 = (this->fVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  return pdVar1[(long)n + 1] - pdVar1[n];
}

Assistant:

double deltaF(int n) {
        // fVal[n + 1] - f[n]
        while (nCounter < n + 1) {
            ++nCounter; fVal.push_back(fFunc(nCounter));
        }
        return fVal[n + 1] - fVal[n];
    }